

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeRollback(Btree *p,int tripCode,int writeOnly)

{
  int *piVar1;
  uint uVar2;
  BtShared *pBt;
  int iVar3;
  int extraout_EAX;
  int extraout_EAX_00;
  MemPage *in_RAX;
  Pgno PVar4;
  MemPage *pPage1;
  MemPage *local_28;
  
  pBt = p->pBt;
  local_28 = in_RAX;
  if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
    btreeLockCarefully(p);
  }
  if (tripCode == 0) {
    if (pBt->pCursor == (BtCursor *)0x0) goto LAB_0011c522;
    writeOnly = 0;
    tripCode = saveCursorsOnList(pBt->pCursor,0,(BtCursor *)0x0);
    if (tripCode == 0) goto LAB_0011c522;
  }
  sqlite3BtreeTripAllCursors(p,tripCode,writeOnly);
LAB_0011c522:
  if (p->inTrans == '\x02') {
    sqlite3PagerRollback(pBt->pPager);
    iVar3 = btreeGetPage(pBt,1,&local_28,0);
    if (iVar3 == 0) {
      uVar2 = *(uint *)(local_28->aData + 0x1c);
      PVar4 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      if (PVar4 == 0) {
        PVar4 = pBt->pPager->dbSize;
      }
      pBt->nPage = PVar4;
      releasePageOne((MemPage *)local_28->pDbPage);
    }
    pBt->inTransaction = '\x01';
    sqlite3BitvecDestroy(pBt->pHasContent);
    pBt->pHasContent = (Bitvec *)0x0;
  }
  btreeEndTransaction(p);
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      unlockBtreeMutex(p);
      return extraout_EAX_00;
    }
  }
  return extraout_EAX;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeRollback(Btree *p, int tripCode, int writeOnly){
  int rc;
  BtShared *pBt = p->pBt;
  MemPage *pPage1;

  assert( writeOnly==1 || writeOnly==0 );
  assert( tripCode==SQLITE_ABORT_ROLLBACK || tripCode==SQLITE_OK );
  sqlite3BtreeEnter(p);
  if( tripCode==SQLITE_OK ){
    rc = tripCode = saveAllCursors(pBt, 0, 0);
    if( rc ) writeOnly = 0;
  }else{
    rc = SQLITE_OK;
  }
  if( tripCode ){
    int rc2 = sqlite3BtreeTripAllCursors(p, tripCode, writeOnly);
    assert( rc==SQLITE_OK || (writeOnly==0 && rc2==SQLITE_OK) );
    if( rc2!=SQLITE_OK ) rc = rc2;
  }
  btreeIntegrity(p);

  if( p->inTrans==TRANS_WRITE ){
    int rc2;

    assert( TRANS_WRITE==pBt->inTransaction );
    rc2 = sqlite3PagerRollback(pBt->pPager);
    if( rc2!=SQLITE_OK ){
      rc = rc2;
    }

    /* The rollback may have destroyed the pPage1->aData value.  So
    ** call btreeGetPage() on page 1 again to make
    ** sure pPage1->aData is set correctly. */
    if( btreeGetPage(pBt, 1, &pPage1, 0)==SQLITE_OK ){
      btreeSetNPage(pBt, pPage1);
      releasePageOne(pPage1);
    }
    assert( countValidCursors(pBt, 1)==0 );
    pBt->inTransaction = TRANS_READ;
    btreeClearHasContent(pBt);
  }

  btreeEndTransaction(p);
  sqlite3BtreeLeave(p);
  return rc;
}